

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  CapturedStream **in_RDX;
  bool bVar4;
  uint uVar5;
  ostream *poVar6;
  char *pcVar7;
  regmatch_t match;
  string error_message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string local_80;
  string local_60;
  string local_40;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStream_abi_cxx11_(&local_40,(internal *)&g_captured_stderr,in_RDX);
  Message::Message((Message *)&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_88.ptr_ + 0x10),"Death test: ",0xc);
  pcVar7 = this->statement_;
  poVar6 = (ostream *)(local_88.ptr_ + 0x10);
  if (pcVar7 == (char *)0x0) {
    sVar3 = 6;
    pcVar7 = "(null)";
  }
  else {
    sVar3 = strlen(pcVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_88.ptr_ + 0x10),"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      if ((this->regex_[8] == (RE)0x1) &&
         (iVar2 = regexec((regex_t *)(this->regex_ + 0x50),local_40._M_dataplus._M_p,1,
                          (regmatch_t *)&local_80,0), iVar2 == 0)) {
        bVar4 = true;
        goto LAB_0023b4d3;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88.ptr_ + 0x10),"    Result: died but not with expected error.\n"
                 ,0x2e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88.ptr_ + 0x10),"  Expected: ",0xc);
      pcVar7 = *(char **)this->regex_;
      poVar6 = (ostream *)(local_88.ptr_ + 0x10);
      if (pcVar7 == (char *)0x0) {
        sVar3 = 6;
        pcVar7 = "(null)";
      }
      else {
        sVar3 = strlen(pcVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_88.ptr_ + 0x10),"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88.ptr_ + 0x10),"Actual msg:\n",0xc);
      FormatDeathTestOutput(&local_80,&local_40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88.ptr_ + 0x10),local_80._M_dataplus._M_p,
                 local_80._M_string_length);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88.ptr_ + 0x10),
                 "    Result: died but not with expected exit code:\n",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88.ptr_ + 0x10),"            ",0xc);
      uVar1 = this->status_;
      Message::Message((Message *)&local_60);
      uVar5 = uVar1 & 0x7f;
      if (uVar5 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_60._M_dataplus._M_p + 0x10),"Exited with exit status ",0x18);
        std::ostream::operator<<((ostream *)(local_60._M_dataplus._M_p + 0x10),uVar1 >> 8 & 0xff);
      }
      else if (0x1ffffff < (int)(uVar5 * 0x1000000 + 0x1000000)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_60._M_dataplus._M_p + 0x10),"Terminated by signal ",0x15);
        std::ostream::operator<<((ostream *)(local_60._M_dataplus._M_p + 0x10),uVar5);
      }
      if ((char)uVar1 < '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_60._M_dataplus._M_p + 0x10)," (core dumped)",0xe);
      }
      StringStreamToString(&local_80,(stringstream *)local_60._M_dataplus._M_p);
      if ((stringstream *)local_60._M_dataplus._M_p != (stringstream *)0x0) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88.ptr_ + 0x10),local_80._M_dataplus._M_p,
                 local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_88.ptr_ + 0x10),"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88.ptr_ + 0x10),"Actual msg:\n",0xc);
      FormatDeathTestOutput(&local_60,&local_40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_88.ptr_ + 0x10),local_60._M_dataplus._M_p,
                 local_60._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    break;
  case LIVED:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88.ptr_ + 0x10),"    Result: failed to die.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88.ptr_ + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_80,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88.ptr_ + 0x10),local_80._M_dataplus._M_p,local_80._M_string_length
              );
    break;
  case RETURNED:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88.ptr_ + 0x10),"    Result: illegal return in test statement.\n",
               0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88.ptr_ + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_80,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88.ptr_ + 0x10),local_80._M_dataplus._M_p,local_80._M_string_length
              );
    break;
  case THREW:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88.ptr_ + 0x10),"    Result: threw an exception.\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88.ptr_ + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_80,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88.ptr_ + 0x10),local_80._M_dataplus._M_p,local_80._M_string_length
              );
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&local_80,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/thirdparty/gmock/gmock-gtest-all.cc"
                       ,0x1b9a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)&local_80);
    goto LAB_0023b4d1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
LAB_0023b4d1:
  bVar4 = false;
LAB_0023b4d3:
  StringStreamToString(&local_80,local_88.ptr_);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_88.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_88.ptr_ + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}